

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBlobImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DataBlobImpl::DataBlobImpl
          (DataBlobImpl *this,IReferenceCounters *pRefCounters,IMemoryAllocator *Allocator,
          size_t InitialSize,void *pData)

{
  pointer __dest;
  value_type_conflict2 local_41;
  allocator_type local_40;
  
  RefCountedObject<Diligent::IDataBlob>::RefCountedObject<>
            ((RefCountedObject<Diligent::IDataBlob> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::IDataBlob>).super_RefCountedObject<Diligent::IDataBlob>.
  super_IDataBlob.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_009305c8;
  local_41 = '\0';
  local_40.m_dvpDescription = "Allocator for vector<Uint8>";
  local_40.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DataBlobImpl.cpp"
  ;
  local_40.m_dvpLineNumber = 0x43;
  local_40.m_Allocator = Allocator;
  std::vector<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>::
  vector(&this->m_DataBuff,InitialSize,&local_41,&local_40);
  if ((pData != (void *)0x0) &&
     (__dest = (this->m_DataBuff).
               super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
               ._M_impl.super__Vector_impl_data._M_start,
     __dest != (this->m_DataBuff).
               super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
    memcpy(__dest,pData,InitialSize);
  }
  return;
}

Assistant:

DataBlobImpl::DataBlobImpl(IReferenceCounters* pRefCounters,
                           IMemoryAllocator&   Allocator,
                           size_t              InitialSize,
                           const void*         pData) :
    TBase{pRefCounters},
    m_DataBuff{InitialSize, Uint8{}, STD_ALLOCATOR_RAW_MEM(Uint8, Allocator, "Allocator for vector<Uint8>")}
{
    if (!m_DataBuff.empty() && pData != nullptr)
    {
        std::memcpy(m_DataBuff.data(), pData, InitialSize);
    }
}